

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::Texture2DArray::Texture2DArray(Texture2DArray *this,deUint32 name)

{
  rc::Texture::Texture(&this->super_Texture,name,TYPE_2D_ARRAY);
  (this->super_Texture).super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__Texture2DArray_01e70d18;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  tcu::Texture2DArrayView::Texture2DArrayView(&this->m_view,0,(ConstPixelBufferAccess *)0x0);
  return;
}

Assistant:

Texture2DArray::Texture2DArray (deUint32 name)
	: Texture	(name, TYPE_2D_ARRAY)
	, m_view	(0, DE_NULL)
{
}